

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<std::tuple<int,int,int>,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<std::tuple<int,int,int>,void> *this,
          tuple<int,_int,_int> *tuple)

{
  ReusableStringStream rss;
  
  ReusableStringStream::ReusableStringStream(&rss);
  std::operator<<(rss.m_oss,'{');
  Detail::TupleElementPrinter<std::tuple<int,_int,_int>,_0UL,_true>::print
            ((tuple<int,_int,_int> *)this,rss.m_oss);
  std::operator<<(rss.m_oss," }");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,&rss);
  ReusableStringStream::~ReusableStringStream(&rss);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(const std::tuple<Types...>& tuple) {
            ReusableStringStream rss;
            rss << '{';
            Detail::TupleElementPrinter<std::tuple<Types...>>::print(tuple, rss.get());
            rss << " }";
            return rss.str();
        }